

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::checkSolution(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *sol)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  Item *pIVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  pointer pnVar6;
  bool bVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  activity;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1c0;
  uint local_188 [2];
  uint auStack_180 [2];
  uint local_178 [2];
  uint auStack_170 [2];
  uint local_168 [4];
  cpp_dec_float<50U,_int,_void> local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  lVar11 = (long)(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (0 < lVar11) {
    do {
      pIVar3 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar10 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar11 + -1].idx;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_1c0,0,(type *)0x0);
      if (0 < pIVar3[iVar10].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar3 = pIVar3 + iVar10;
        lVar14 = 0;
        lVar13 = 0;
        do {
          pNVar4 = (pIVar3->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)((long)&(pNVar4->val).m_backend.data + lVar14);
          pcVar12 = &(sol->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar4->val + 1) + lVar14)].m_backend;
          local_1f8.fpclass = cpp_dec_float_finite;
          local_1f8.prec_elem = 10;
          local_1f8.data._M_elems[0] = 0;
          local_1f8.data._M_elems[1] = 0;
          local_1f8.data._M_elems[2] = 0;
          local_1f8.data._M_elems[3] = 0;
          local_1f8.data._M_elems[4] = 0;
          local_1f8.data._M_elems[5] = 0;
          local_1f8.data._M_elems._24_5_ = 0;
          local_1f8.data._M_elems[7]._1_3_ = 0;
          local_1f8.data._M_elems._32_5_ = 0;
          local_1f8.data._M_elems[9]._1_3_ = 0;
          local_1f8.exp = 0;
          local_1f8.neg = false;
          v = pcVar1;
          if ((&local_1f8 != pcVar12) && (v = pcVar12, pcVar1 != &local_1f8)) {
            uVar5 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_1f8.data._M_elems._32_5_ = SUB85(uVar5,0);
            local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_1f8.data._M_elems._24_5_ = SUB85(uVar5,0);
            local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_1f8.exp = *(int *)((long)&(pNVar4->val).m_backend.data + lVar14 + 0x28);
            local_1f8.neg = *(bool *)((long)&(pNVar4->val).m_backend.data + lVar14 + 0x2c);
            local_1f8._48_8_ = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar14 + 0x30);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_1f8,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_1c0,&local_1f8);
          lVar13 = lVar13 + 1;
          lVar14 = lVar14 + 0x3c;
        } while (lVar13 < (pIVar3->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      lVar13 = lVar11 + -1;
      local_d8.m_backend.data._M_elems[8] = local_1c0.data._M_elems[8];
      local_d8.m_backend.data._M_elems[9] = local_1c0.data._M_elems[9];
      local_d8.m_backend.data._M_elems[4] = local_1c0.data._M_elems[4];
      local_d8.m_backend.data._M_elems[5] = local_1c0.data._M_elems[5];
      local_d8.m_backend.data._M_elems[6] = local_1c0.data._M_elems[6];
      local_d8.m_backend.data._M_elems[7] = local_1c0.data._M_elems[7];
      local_d8.m_backend.data._M_elems[0] = local_1c0.data._M_elems[0];
      local_d8.m_backend.data._M_elems[1] = local_1c0.data._M_elems[1];
      local_d8.m_backend.data._M_elems[2] = local_1c0.data._M_elems[2];
      local_d8.m_backend.data._M_elems[3] = local_1c0.data._M_elems[3];
      local_d8.m_backend.exp = local_1c0.exp;
      local_d8.m_backend.neg = local_1c0.neg;
      local_d8.m_backend.fpclass = local_1c0.fpclass;
      local_d8.m_backend.prec_elem = local_1c0.prec_elem;
      pnVar6 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_118.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[lVar13].m_backend.data;
      local_118.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar6[lVar13].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar6[lVar13].m_backend.data + 0x10);
      local_118.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_118.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_118.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&pnVar6[lVar13].m_backend.data + 0x20);
      local_118.m_backend.exp = pnVar6[lVar13].m_backend.exp;
      local_118.m_backend.neg = pnVar6[lVar13].m_backend.neg;
      local_118.m_backend.fpclass = pnVar6[lVar13].m_backend.fpclass;
      local_118.m_backend.prec_elem = pnVar6[lVar13].m_backend.prec_elem;
      feastol(&local_68,this);
      bVar9 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_d8,&local_118,&local_68);
      uVar5 = local_1c0._48_8_;
      bVar7 = local_1c0.neg;
      iVar10 = local_1c0.exp;
      if (!bVar9) {
        return false;
      }
      local_168[0] = local_1c0.data._M_elems[8];
      local_168[1] = local_1c0.data._M_elems[9];
      local_178[0] = local_1c0.data._M_elems[4];
      local_178[1] = local_1c0.data._M_elems[5];
      auStack_170[0] = local_1c0.data._M_elems[6];
      auStack_170[1] = local_1c0.data._M_elems[7];
      local_188[0] = local_1c0.data._M_elems[0];
      local_188[1] = local_1c0.data._M_elems[1];
      auStack_180[0] = local_1c0.data._M_elems[2];
      auStack_180[1] = local_1c0.data._M_elems[3];
      pnVar6 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar6[lVar13].m_backend.data + 0x20);
      local_158.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[lVar13].m_backend.data;
      local_158.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[lVar13].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar6[lVar13].m_backend.data + 0x10);
      local_158.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_158.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_158.exp = pnVar6[lVar13].m_backend.exp;
      local_158.neg = pnVar6[lVar13].m_backend.neg;
      local_158.fpclass = pnVar6[lVar13].m_backend.fpclass;
      local_158.prec_elem = pnVar6[lVar13].m_backend.prec_elem;
      feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_a0,this);
      uVar8 = local_1c0._48_8_;
      local_1f8.data._M_elems._32_5_ = SUB85(local_168._0_8_,0);
      local_1f8.data._M_elems[9]._1_3_ = SUB83(local_168._0_8_,5);
      local_1f8.data._M_elems[4] = local_178[0];
      local_1f8.data._M_elems[5] = local_178[1];
      local_1f8.data._M_elems._24_5_ = auStack_170._0_5_;
      local_1f8.data._M_elems[7]._1_3_ = auStack_170[1]._1_3_;
      local_1f8.data._M_elems[0] = local_188[0];
      local_1f8.data._M_elems[1] = local_188[1];
      local_1f8.data._M_elems[2] = auStack_180[0];
      local_1f8.data._M_elems[3] = auStack_180[1];
      local_1f8.exp = iVar10;
      local_1f8.neg = bVar7;
      local_1c0.fpclass = (fpclass_type)uVar5;
      local_1c0.prec_elem = SUB84(uVar5,4);
      local_1f8.fpclass = local_1c0.fpclass;
      local_1f8.prec_elem = local_1c0.prec_elem;
      local_1c0._48_8_ = uVar8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_1f8,&local_158);
      if (local_1f8.fpclass == cpp_dec_float_NaN) {
        return false;
      }
      if (local_a0.fpclass == cpp_dec_float_NaN) {
        return false;
      }
      iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_1f8,&local_a0);
      if (-1 < iVar10) {
        return false;
      }
      bVar7 = 1 < lVar11;
      lVar11 = lVar13;
    } while (bVar7);
  }
  return true;
}

Assistant:

bool SPxMainSM<R>::checkSolution(SPxLPBase<R>& lp, VectorBase<R> sol)
{
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);
      R activity = 0;

      for(int k = 0; k < row.size(); k++)
         activity += row.value(k) * sol[row.index(k)];

      if(!GE(activity, lp.lhs(i), feastol()) || !LE(activity, lp.rhs(i), feastol()))
         return false;
   }

   return true;
}